

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

parser_error parse_entry_label(parser *p)

{
  long *plVar1;
  char *src;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  size_t nw2;
  size_t nw;
  char *name;
  embryonic_ui_entry *embryo;
  parser *p_local;
  
  plVar1 = (long *)parser_priv(p);
  if (plVar1 == (long *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    src = parser_getstr(p,"label");
    mem_free(*(void **)(*plVar1 + 0x20));
    pvVar2 = mem_alloc(0x144);
    *(void **)(*plVar1 + 0x20) = pvVar2;
    sVar3 = text_mbstowcs(*(wchar_t **)(*plVar1 + 0x20),src,L'P');
    if (sVar3 == 0xffffffffffffffff) {
      p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
    }
    else {
      sVar4 = text_mbstowcs((wchar_t *)(*(long *)(*plVar1 + 0x20) + sVar3 * 4),"",L'\x01');
      if (sVar4 == 0xffffffffffffffff) {
        p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
      }
      else {
        *(int *)(*plVar1 + 0x1a4) = (int)sVar3;
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_entry_label(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	const char *name;
	size_t nw;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	name = parser_getstr(p, "label");
	mem_free(embryo->entry->label);
	embryo->entry->label = mem_alloc((MAX_ENTRY_LABEL + 1) *
		sizeof(*embryo->entry->label));
	nw = text_mbstowcs(embryo->entry->label, name, MAX_ENTRY_LABEL);
	if (nw != (size_t)-1) {
		/* Ensure null termination. */
		size_t nw2 = text_mbstowcs(embryo->entry->label + nw, "", 1);

		if (nw2 != (size_t)-1) {
			embryo->entry->nlabel = nw;
		} else {
			return PARSE_ERROR_INVALID_VALUE;
		}
	} else {
		return PARSE_ERROR_INVALID_VALUE;
	}
	return PARSE_ERROR_NONE;
}